

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testStatsdClient.cpp
# Opt level: O3

void throwOnWrongMessage(StatsdServer *server,string *expected)

{
  _Alloc_hider _Var1;
  int iVar2;
  ostream *poVar3;
  runtime_error *this;
  string actual;
  string local_30;
  
  Statsd::StatsdServer::receive_abi_cxx11_(&local_30,server);
  _Var1._M_p = local_30._M_dataplus._M_p;
  if (local_30._M_string_length == expected->_M_string_length) {
    if (local_30._M_string_length != 0) {
      iVar2 = bcmp(local_30._M_dataplus._M_p,(expected->_M_dataplus)._M_p,local_30._M_string_length)
      ;
      if (iVar2 != 0) goto LAB_00103895;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var1._M_p != &local_30.field_2) {
      operator_delete(_Var1._M_p);
    }
    return;
  }
LAB_00103895:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Expected: ",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cerr,(expected->_M_dataplus)._M_p,expected->_M_string_length)
  ;
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," but got: ",10);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar3,local_30._M_dataplus._M_p,local_30._M_string_length);
  std::endl<char,std::char_traits<char>>(poVar3);
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this,"Incorrect stat received");
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void throwOnWrongMessage(StatsdServer& server, const std::string& expected) {
    auto actual = server.receive();
    if (actual != expected) {
        std::cerr << "Expected: " << expected << " but got: " << actual << std::endl;
        throw std::runtime_error("Incorrect stat received");
    }
}